

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng_decoder_settings_init(LodePNGDecoderSettings *settings)

{
  LodePNGDecompressSettings *in_RDI;
  
  *(undefined4 *)((long)&in_RDI[1].max_output_size + 4) = 1;
  *(undefined4 *)&in_RDI[1].custom_zlib = 1;
  *(undefined4 *)((long)&in_RDI[1].custom_zlib + 4) = 0;
  in_RDI[1].custom_inflate =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)
       (pbrt::pmj02bnSamples + 0x1b5190);
  in_RDI[1].custom_context = pbrt::pmj02bnSamples + 0x1b5190;
  in_RDI[1].ignore_adler32 = 0;
  in_RDI[1].ignore_nlen = 0;
  *(undefined4 *)&in_RDI[1].max_output_size = 0;
  lodepng_decompress_settings_init(in_RDI);
  return;
}

Assistant:

void lodepng_decoder_settings_init(LodePNGDecoderSettings* settings) {
  settings->color_convert = 1;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  settings->read_text_chunks = 1;
  settings->remember_unknown_chunks = 0;
  settings->max_text_size = 16777216;
  settings->max_icc_size = 16777216; /* 16MB is much more than enough for any reasonable ICC profile */
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  settings->ignore_crc = 0;
  settings->ignore_critical = 0;
  settings->ignore_end = 0;
  lodepng_decompress_settings_init(&settings->zlibsettings);
}